

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

Element __thiscall wasm::RandomFullLattice::makeElement(RandomFullLattice *this)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  _Head_base<0UL,_void_*,_false> _Var4;
  undefined8 *in_RSI;
  RandomFullLattice *this_00;
  size_t i;
  ulong uVar5;
  type *l;
  Element EVar6;
  undefined8 uStack_a0;
  RandomFullLattice local_98;
  RandomFullLattice local_88;
  undefined1 auStack_78 [8];
  vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
  elem;
  _Variadic_union<bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  local_58;
  undefined1 local_38;
  
  lVar1 = in_RSI[1];
  if (lVar1 == 0) {
switchD_001a3fbb_default:
    wasm::handle_unreachable
              ("unexpected lattice",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,0x153);
  }
  switch(*(undefined1 *)(lVar1 + 0x20)) {
  case 0:
    bVar2 = Random::pick<bool,bool>((Random *)*in_RSI,true,false);
    local_58._M_first._M_storage = (_Uninitialized<bool,_true>)bVar2;
    local_38 = 0;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    break;
  case 1:
    uVar3 = Random::upToSquared((Random *)*in_RSI,0x21);
    local_58._M_rest._0_4_ = (undefined4)uVar3;
    local_38 = 1;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    break;
  case 2:
    uVar3 = Random::upTo((Random *)*in_RSI,8);
    uStack_a0 = 0;
    switch(uVar3) {
    case 0:
      uStack_a0 = 1;
      break;
    case 2:
      uStack_a0 = 2;
      break;
    case 3:
      uStack_a0 = 4;
      break;
    case 4:
      bVar2 = Random::oneIn((Random *)*in_RSI,2);
      Type::Type((Type *)&local_58._M_first,(HeapType)0x20,(uint)bVar2,Inexact);
      uStack_a0 = local_58._0_8_;
      break;
    case 5:
      bVar2 = Random::oneIn((Random *)*in_RSI,2);
      Type::Type((Type *)&local_58._M_first,(HeapType)0x58,(uint)bVar2,Inexact);
      uStack_a0 = local_58._0_8_;
      break;
    case 6:
      bVar2 = Random::oneIn((Random *)*in_RSI,2);
      Type::Type((Type *)&local_58._M_first,(HeapType)0x38,(uint)bVar2,Inexact);
      uStack_a0 = local_58._0_8_;
      break;
    case 7:
      bVar2 = Random::oneIn((Random *)*in_RSI,2);
      Type::Type((Type *)&local_58._M_first,(HeapType)0x40,(uint)bVar2,Inexact);
      uStack_a0 = local_58._0_8_;
    }
    local_38 = 2;
    local_58._0_8_ = uStack_a0;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    break;
  case 3:
    makeElement((RandomFullLattice *)auStack_78);
    local_58._0_8_ = auStack_78;
    local_58._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38 = 3;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_58._M_first);
    this_00 = (RandomFullLattice *)auStack_78;
    goto LAB_001a417b;
  case 4:
    makeElement((RandomFullLattice *)auStack_78);
    makeElement((RandomFullLattice *)
                &elem.
                 super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
    ::
    variant<std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,void,void,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,void>
              ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                *)&local_58._M_first,
               (array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL> *)auStack_78);
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_58._M_first);
    std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>::~array
              ((array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL> *)auStack_78);
    _Var4._M_head_impl = extraout_RDX;
    goto LAB_001a4266;
  case 5:
    auStack_78 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::reserve((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
               *)auStack_78,*(size_type *)(lVar1 + 0x10));
    for (uVar5 = 0; uVar5 < *(ulong *)(lVar1 + 0x10); uVar5 = uVar5 + 1) {
      makeElement((RandomFullLattice *)&local_58._M_first);
      std::
      vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>
      ::emplace_back<wasm::RandomElement<wasm::RandomFullLattice>>
                ((vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>
                  *)auStack_78,(RandomElement<wasm::RandomFullLattice> *)&local_58._M_first);
      std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<void,_void_(*)(void_*)> *)&local_58._M_first);
    }
    local_58._0_8_ = auStack_78;
    local_58._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._16_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_78 = (undefined1  [8])0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38 = 5;
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_58._M_first);
    std::
    vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~vector((vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
               *)auStack_78);
    _Var4._M_head_impl = extraout_RDX_01;
    goto LAB_001a4266;
  case 6:
    makeElement(&local_98);
    makeElement(&local_88);
    std::
    tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
    ::
    tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>,_true>
              ((tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
                *)auStack_78,(RandomElement<wasm::RandomFullLattice> *)&local_98,
               (RandomElement<wasm::RandomFullLattice> *)&local_88);
    std::
    variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
    ::
    variant<std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>,void,void,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>,void>
              ((variant<bool,unsigned_int,wasm::Type,wasm::RandomElement<wasm::RandomFullLattice>,std::array<wasm::RandomElement<wasm::RandomFullLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomFullLattice>,std::allocator<wasm::RandomElement<wasm::RandomFullLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,wasm::RandomElement<wasm::RandomFullLattice>>>
                *)&local_58._M_first,
               (tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
                *)auStack_78);
    RandomElement<wasm::RandomFullLattice>::RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)this,(ElementImpl *)&local_58._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
    ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                         *)&local_58._M_first);
    std::
    _Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>
                    *)auStack_78);
    std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<void,_void_(*)(void_*)> *)&local_88);
    this_00 = &local_98;
LAB_001a417b:
    std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<void,_void_(*)(void_*)> *)this_00);
    _Var4._M_head_impl = extraout_RDX_00;
    goto LAB_001a4266;
  default:
    goto switchD_001a3fbb_default;
  }
  std::__detail::__variant::
  _Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::~_Variant_storage((_Variant_storage<false,_bool,_unsigned_int,_wasm::Type,_wasm::RandomElement<wasm::RandomFullLattice>,_std::array<wasm::RandomElement<wasm::RandomFullLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::RandomElement<wasm::RandomFullLattice>_>_>
                       *)&local_58._M_first);
  _Var4._M_head_impl = extraout_RDX_02;
LAB_001a4266:
  EVar6.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  EVar6.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar6.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomFullLattice::Element RandomFullLattice::makeElement() const noexcept {
  if (std::get_if<Bool>(lattice.get())) {
    return ElementImpl{rand.pick(true, false)};
  }
  if (std::get_if<UInt32>(lattice.get())) {
    return ElementImpl{rand.upToSquared(33)};
  }
  if (std::get_if<ValType>(lattice.get())) {
    Type type;
    // Choose a random type. No need to make all possible types available as
    // long as we cover all the kinds of relationships between types.
    switch (rand.upTo(8)) {
      case 0:
        type = Type::unreachable;
        break;
      case 1:
        type = Type::none;
        break;
      case 2:
        type = Type::i32;
        break;
      case 3:
        type = Type::f32;
        break;
      case 4:
        type = Type(HeapType::any, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 5:
        type = Type(HeapType::none, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 6:
        type = Type(HeapType::struct_, rand.oneIn(2) ? Nullable : NonNullable);
        break;
      case 7:
        type = Type(HeapType::array, rand.oneIn(2) ? Nullable : NonNullable);
        break;
    }
    return ElementImpl{type};
  }
  if (const auto* l = std::get_if<Inverted<RandomFullLattice>>(lattice.get())) {
    return ElementImpl{l->lattice.makeElement()};
  }
  if (const auto* l = std::get_if<ArrayFullLattice>(lattice.get())) {
    return ElementImpl{typename ArrayFullLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomFullLattice>>(lattice.get())) {
    std::vector<typename RandomFullLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleFullLattice>(lattice.get())) {
    return ElementImpl{typename TupleFullLattice::Element{
      std::get<0>(l->lattices).makeElement(),
      std::get<1>(l->lattices).makeElement()}};
  }
  WASM_UNREACHABLE("unexpected lattice");
}